

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

void Kit_SopDivideByLiteralQuo(Kit_Sop_t *cSop,int iLit)

{
  int iVar1;
  uint uCube_00;
  bool bVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int k;
  int i;
  uint uCube;
  int iLit_local;
  Kit_Sop_t *cSop_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    iVar1 = Kit_SopCubeNum(cSop);
    bVar2 = false;
    if (local_1c < iVar1) {
      k = Kit_SopCube(cSop,local_1c);
      bVar2 = k != 0;
    }
    if (!bVar2) break;
    iVar1 = Kit_CubeHasLit(k,iLit);
    if (iVar1 != 0) {
      uCube_00 = Kit_CubeRemLit(k,iLit);
      Kit_SopWriteCube(cSop,uCube_00,local_20);
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  }
  Kit_SopShrink(cSop,local_20);
  return;
}

Assistant:

void Kit_SopDivideByLiteralQuo( Kit_Sop_t * cSop, int iLit )
{
    unsigned uCube;
    int i, k = 0;
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( Kit_CubeHasLit(uCube, iLit) )
            Kit_SopWriteCube( cSop, Kit_CubeRemLit(uCube, iLit), k++ );
    }
    Kit_SopShrink( cSop, k );
}